

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Opt::parse(Opt *this,string *param_2,TokenStream *tokens)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  Token *pTVar4;
  element_type *peVar5;
  ParseResultType *pPVar6;
  long *in_RSI;
  InternalParseResult *in_RDI;
  ParserResult result_1;
  Token *argToken;
  BoundValueRefBase *valueRef;
  ParserResult result;
  BoundFlagRefBase *flagRef;
  Token *token;
  TokenStream remainingTokens;
  Result validationResult;
  ParseState *in_stack_fffffffffffffd38;
  ParseState *in_stack_fffffffffffffd40;
  BasicResult<Catch::clara::detail::ParseResultType> *in_stack_fffffffffffffd48;
  undefined6 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  BasicResult<void> *in_stack_fffffffffffffd58;
  BasicResult<Catch::clara::detail::ParseState> *in_stack_fffffffffffffd60;
  InternalParseResult *__lhs;
  string *in_stack_fffffffffffffdb0;
  Opt *in_stack_fffffffffffffdb8;
  BasicResult local_1c8 [48];
  string local_198 [32];
  int local_178 [2];
  undefined1 auStack_170 [32];
  int *local_150;
  string local_148 [32];
  element_type *local_128;
  BasicResult local_f0 [48];
  element_type *local_c0;
  undefined1 local_b8 [40];
  undefined1 *local_90;
  int local_60;
  BasicResult local_50 [80];
  
  __lhs = in_RDI;
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = BasicResult::operator_cast_to_bool(local_50);
  if (!bVar1) {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_60 = 1;
    goto LAB_00347a8b;
  }
  TokenStream::TokenStream
            ((TokenStream *)in_stack_fffffffffffffd40,(TokenStream *)in_stack_fffffffffffffd38);
  bVar1 = TokenStream::operator_cast_to_bool((TokenStream *)in_stack_fffffffffffffd40);
  if ((bVar1) &&
     (pTVar4 = TokenStream::operator->((TokenStream *)in_stack_fffffffffffffd40),
     pTVar4->type == Option)) {
    TokenStream::operator*((TokenStream *)in_stack_fffffffffffffd48);
    local_90 = local_b8;
    bVar1 = isMatch(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x347495);
      uVar3 = (*peVar5->_vptr_BoundRef[3])();
      if ((uVar3 & 1) == 0) {
        local_128 = std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::
                    get((__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2> *)
                        (in_RSI + 2));
        TokenStream::operator++((TokenStream *)in_stack_fffffffffffffd60);
        uVar2 = TokenStream::operator_cast_to_bool((TokenStream *)in_stack_fffffffffffffd40);
        if (!(bool)uVar2) {
          ::std::operator+((char *)__lhs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_RDI);
          BasicResult<Catch::clara::detail::ParseState>::runtimeError
                    ((string *)in_stack_fffffffffffffd38);
          ::std::__cxx11::string::~string(local_148);
          local_60 = 1;
          goto LAB_003479e1;
        }
        TokenStream::operator*((TokenStream *)in_stack_fffffffffffffd48);
        local_150 = local_178;
        if (local_178[0] == 1) {
          (*local_128->_vptr_BoundRef[4])(local_1c8,local_128,auStack_170);
          bVar1 = BasicResult::operator_cast_to_bool(local_1c8);
          if (bVar1) {
            pPVar6 = ResultValueBase<Catch::clara::detail::ParseResultType>::value
                               ((ResultValueBase<Catch::clara::detail::ParseResultType> *)
                                in_stack_fffffffffffffd40);
            if (*pPVar6 == ShortCircuitAll) {
              in_stack_fffffffffffffd40 =
                   (ParseState *)
                   ResultValueBase<Catch::clara::detail::ParseResultType>::value
                             ((ResultValueBase<Catch::clara::detail::ParseResultType> *)
                              in_stack_fffffffffffffd40);
              ParseState::ParseState
                        (in_stack_fffffffffffffd40,
                         (ParseResultType)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                         (TokenStream *)0x3478b3);
              BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                        (in_stack_fffffffffffffd38);
              ParseState::~ParseState((ParseState *)0x3478d6);
              local_60 = 1;
            }
            else {
              local_60 = 0;
            }
          }
          else {
            BasicResult<Catch::clara::detail::ParseState>::
            BasicResult<Catch::clara::detail::ParseResultType>
                      ((BasicResult<Catch::clara::detail::ParseState> *)
                       CONCAT17(uVar2,CONCAT16(bVar1,in_stack_fffffffffffffd50)),
                       in_stack_fffffffffffffd48);
            local_60 = 1;
          }
          BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                    ((BasicResult<Catch::clara::detail::ParseResultType> *)in_stack_fffffffffffffd40
                    );
        }
        else {
          ::std::operator+((char *)__lhs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_RDI);
          BasicResult<Catch::clara::detail::ParseState>::runtimeError
                    ((string *)in_stack_fffffffffffffd38);
          ::std::__cxx11::string::~string(local_198);
          local_60 = 1;
        }
        Token::~Token((Token *)0x34792b);
      }
      else {
        local_c0 = std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::
                   get((__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2> *)
                       (in_RSI + 2));
        (*local_c0->_vptr_BoundRef[4])(local_f0,local_c0,1);
        bVar1 = BasicResult::operator_cast_to_bool(local_f0);
        if (bVar1) {
          in_stack_fffffffffffffd60 =
               (BasicResult<Catch::clara::detail::ParseState> *)
               ResultValueBase<Catch::clara::detail::ParseResultType>::value
                         ((ResultValueBase<Catch::clara::detail::ParseResultType> *)
                          in_stack_fffffffffffffd40);
          if (*(int *)&(in_stack_fffffffffffffd60->
                       super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.
                       _vptr_ResultBase == 2) {
            ResultValueBase<Catch::clara::detail::ParseResultType>::value
                      ((ResultValueBase<Catch::clara::detail::ParseResultType> *)
                       in_stack_fffffffffffffd40);
            ParseState::ParseState
                      (in_stack_fffffffffffffd40,
                       (ParseResultType)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                       (TokenStream *)0x3475c8);
            BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                      (in_stack_fffffffffffffd38);
            ParseState::~ParseState((ParseState *)0x3475eb);
            local_60 = 1;
          }
          else {
            local_60 = 0;
          }
        }
        else {
          BasicResult<Catch::clara::detail::ParseState>::
          BasicResult<Catch::clara::detail::ParseResultType>
                    ((BasicResult<Catch::clara::detail::ParseState> *)
                     CONCAT17(in_stack_fffffffffffffd57,
                              CONCAT16(in_stack_fffffffffffffd56,in_stack_fffffffffffffd50)),
                     in_stack_fffffffffffffd48);
          local_60 = 1;
        }
        BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                  ((BasicResult<Catch::clara::detail::ParseResultType> *)in_stack_fffffffffffffd40);
      }
      if (local_60 == 0) {
        in_stack_fffffffffffffd38 =
             (ParseState *)TokenStream::operator++((TokenStream *)in_stack_fffffffffffffd60);
        ParseState::ParseState
                  (in_stack_fffffffffffffd40,
                   (ParseResultType)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                   (TokenStream *)0x347983);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  (in_stack_fffffffffffffd38);
        ParseState::~ParseState((ParseState *)0x3479a6);
        local_60 = 1;
      }
    }
    else {
      local_60 = 0;
    }
LAB_003479e1:
    Token::~Token((Token *)0x3479ee);
    if (local_60 == 0) goto LAB_00347a0c;
  }
  else {
LAB_00347a0c:
    ParseState::ParseState
              (in_stack_fffffffffffffd40,(ParseResultType)((ulong)in_stack_fffffffffffffd38 >> 0x20)
               ,(TokenStream *)0x347a23);
    BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
              (in_stack_fffffffffffffd38);
    ParseState::~ParseState((ParseState *)0x347a40);
    local_60 = 1;
  }
  TokenStream::~TokenStream((TokenStream *)0x347a7a);
LAB_00347a8b:
  BasicResult<void>::~BasicResult((BasicResult<void> *)in_stack_fffffffffffffd40);
  return __lhs;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            if( remainingTokens && remainingTokens->type == TokenType::Option ) {
                auto const &token = *remainingTokens;
                if( isMatch(token.token ) ) {
                    if( m_ref->isFlag() ) {
                        auto flagRef = static_cast<detail::BoundFlagRefBase*>( m_ref.get() );
                        auto result = flagRef->setFlag( true );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    } else {
                        auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );
                        ++remainingTokens;
                        if( !remainingTokens )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto const &argToken = *remainingTokens;
                        if( argToken.type != TokenType::Argument )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto result = valueRef->setValue( argToken.token );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    }
                    return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
                }
            }
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );
        }